

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
CreateAttributesDecoder
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          int32_t att_decoder_id)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  MeshEdgebreakerDecoder *pMVar4;
  DecoderBuffer *pDVar5;
  long lVar6;
  pointer pAVar7;
  Mesh *pMVar8;
  TraversalObserver traversal_observer;
  bool bVar9;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *this_00;
  tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  this_01;
  byte bVar10;
  ushort uVar11;
  int *piVar12;
  byte bVar13;
  ulong uVar14;
  AttTraverser att_traverser;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  local_f8;
  __uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> local_f0;
  CornerTable *local_e8;
  MeshAttributeIndicesEncodingData *pMStack_e0;
  Mesh *local_d8;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *pMStack_d0;
  undefined1 local_c8 [136];
  pointer pIStack_40;
  pointer local_38;
  
  pMVar4 = this->decoder_;
  pDVar5 = (pMVar4->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  lVar6 = pDVar5->data_size_;
  lVar1 = pDVar5->pos_ + 1;
  if (lVar1 <= lVar6) {
    bVar2 = pDVar5->data_[pDVar5->pos_];
    pDVar5->pos_ = lVar1;
    lVar1 = pDVar5->pos_ + 1;
    if (lVar1 <= lVar6) {
      cVar3 = pDVar5->data_[pDVar5->pos_];
      pDVar5->pos_ = lVar1;
      if ((char)bVar2 < '\0') {
        if (this->pos_data_decoder_id_ < 0) {
          piVar12 = &this->pos_data_decoder_id_;
          goto LAB_001262ff;
        }
      }
      else {
        pAVar7 = (this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = ((long)(this->attribute_data_).
                        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 6) *
                 -0x3333333333333333;
        if ((bVar2 <= uVar14 && uVar14 - bVar2 != 0) &&
           (*(int *)((long)&pAVar7->decoder_id + (ulong)((uint)bVar2 * 0x140)) < 0)) {
          piVar12 = (int *)((long)&pAVar7->decoder_id + (ulong)((uint)bVar2 * 0x140));
LAB_001262ff:
          *piVar12 = att_decoder_id;
          uVar11._0_1_ = (pMVar4->super_MeshDecoder).super_PointCloudDecoder.version_major_;
          uVar11._1_1_ = (pMVar4->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
          uVar11 = uVar11 << 8 | uVar11 >> 8;
          bVar10 = 0;
          if (0x101 < uVar11) {
            lVar1 = pDVar5->pos_ + 1;
            if (lVar1 <= lVar6) {
              uVar11 = (ushort)(byte)pDVar5->data_[pDVar5->pos_];
              pDVar5->pos_ = lVar1;
            }
            bVar13 = (byte)uVar11;
            bVar10 = bVar13;
            if (1 < bVar13) {
              bVar10 = 0;
            }
            if (lVar6 < lVar1) {
              return false;
            }
            if (1 < bVar13) {
              return false;
            }
          }
          if (cVar3 == '\0') {
            if (-1 < (char)bVar2) {
              (&((this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start)->is_connectivity_used)
              [(uint)bVar2 * 0x140] = false;
            }
            if (bVar10 == 1) {
              CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                        ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>
                          *)local_c8,(MeshAttributeIndicesEncodingData *)this);
              local_f0._M_t.
              super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
              .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
                   (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
                   (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
                   local_c8._0_8_;
            }
            else {
              CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                        ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>
                          *)local_c8,(MeshAttributeIndicesEncodingData *)this);
              local_f0._M_t.
              super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
              .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
                   (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
                   (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
                   local_c8._0_8_;
            }
          }
          else {
            if (bVar10 != 0) {
              return false;
            }
            if ((char)bVar2 < '\0') {
              return false;
            }
            pMVar8 = (pMVar4->super_MeshDecoder).mesh_;
            pAVar7 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            this_00 = (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                       *)operator_new(0xc0);
            local_e8 = (CornerTable *)
                       ((long)&(pAVar7->connectivity_data).is_edge_on_seam_.
                               super__Bvector_base<std::allocator<bool>_> +
                       (ulong)((uint)bVar2 * 0x140));
            pMStack_e0 = (MeshAttributeIndicesEncodingData *)
                         ((long)&(pAVar7->encoding_data).encoded_attribute_value_index_to_corner_map
                                 .
                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         + (ulong)((uint)bVar2 * 0x140));
            (this_00->super_PointsSequencer).out_point_ids_ =
                 (vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                  *)0x0;
            (this_00->super_PointsSequencer)._vptr_PointsSequencer =
                 (_func_int **)&PTR__MeshTraversalSequencer_00183278;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            *(uint *)((long)&(this_00->traverser_).
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish + 8) = 0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            *(uint *)((long)&(this_00->traverser_).
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish + 8) = 0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .corner_table_ = (CornerTable *)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .traversal_observer_.att_connectivity_ = (MeshAttributeCornerTable *)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .traversal_observer_.encoding_data_ = (MeshAttributeIndicesEncodingData *)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .traversal_observer_.mesh_ = (Mesh *)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .traversal_observer_.sequencer_ = (PointsSequencer *)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            *(uint *)((long)&(this_00->traverser_).
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start + 8) = 0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            *(uint *)((long)&(this_00->traverser_).
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             .is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start + 8) = 0;
            (this_00->traverser_).
            super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            ._vptr_TraverserBase = (_func_int **)&PTR__DepthFirstTraverser_00183078;
            (this_00->traverser_).corner_traversal_stack_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->traverser_).corner_traversal_stack_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (this_00->traverser_).corner_traversal_stack_.
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00->mesh_ = pMVar8;
            this_00->encoding_data_ = pMStack_e0;
            this_00->corner_order_ =
                 (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  *)0x0;
            local_c8._64_8_ = (_Bit_type *)0x0;
            local_c8._72_4_ = 0;
            local_c8._104_8_ = (pointer)0x0;
            local_c8._112_4_ = 0;
            local_c8._120_8_ = (_Bit_pointer)0x0;
            local_c8._8_8_ = (CornerTable *)0x0;
            local_c8._16_8_ =
                 (__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>)0x0;
            local_c8._24_8_ = (MeshAttributeIndicesEncodingData *)0x0;
            local_c8._32_8_ = (Mesh *)0x0;
            local_c8._40_8_ = (PointsSequencer *)0x0;
            local_c8._48_8_ = (_Bit_type *)0x0;
            local_c8._56_4_ = 0;
            local_c8._80_8_ = (pointer)0x0;
            local_c8._88_8_ = (pointer)0x0;
            local_c8._96_4_ = 0;
            local_c8._0_8_ = &PTR__DepthFirstTraverser_00183078;
            local_c8._128_8_ = (pointer)0x0;
            pIStack_40 = (pointer)0x0;
            local_38 = (pointer)0x0;
            traversal_observer.encoding_data_ = pMStack_e0;
            traversal_observer.att_connectivity_ = local_e8;
            traversal_observer.mesh_ = pMVar8;
            traversal_observer.sequencer_ = (PointsSequencer *)this_00;
            local_d8 = pMVar8;
            pMStack_d0 = this_00;
            TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            ::Init((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                    *)local_c8,local_e8,traversal_observer);
            MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
            ::SetTraverser(this_00,(DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                    *)local_c8);
            DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            ::~DepthFirstTraverser
                      ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                        *)local_c8);
            local_f0._M_t.
            super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
            .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
                 (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
                 (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
                 this_00;
          }
          if ((_Head_base<0UL,_draco::PointsSequencer_*,_false>)
              local_f0._M_t.
              super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
              .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl ==
              (_Head_base<0UL,_draco::PointsSequencer_*,_false>)0x0) {
            return false;
          }
          this_01.
          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                )operator_new(0x80);
          SequentialAttributeDecodersController::SequentialAttributeDecodersController
                    ((SequentialAttributeDecodersController *)
                     this_01.
                     super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                     .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl
                     ,(unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                       *)&local_f0);
          if ((_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
               )local_f0._M_t.
                super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl !=
              (PointsSequencer *)0x0) {
            (**(code **)(*(long *)local_f0._M_t.
                                  super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                                  .super__Head_base<0UL,_draco::PointsSequencer_*,_false>.
                                  _M_head_impl + 8))();
          }
          local_f0._M_t.
          super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
          .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
               (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
               (_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                )0x0;
          local_f8._M_t.
          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
               (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                )(tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                  )this_01.
                   super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                   .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
          bVar9 = PointCloudDecoder::SetAttributesDecoder
                            ((PointCloudDecoder *)this->decoder_,att_decoder_id,
                             (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                              *)&local_f8);
          if ((_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
               )local_f8._M_t.
                super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl ==
              (AttributesDecoderInterface *)0x0) {
            return bVar9;
          }
          (**(code **)(*(long *)local_f8._M_t.
                                super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                                _M_head_impl + 8))();
          return bVar9;
        }
      }
    }
  }
  return false;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::CreateAttributesDecoder(
    int32_t att_decoder_id) {
  int8_t att_data_id;
  if (!decoder_->buffer()->Decode(&att_data_id)) {
    return false;
  }
  uint8_t decoder_type;
  if (!decoder_->buffer()->Decode(&decoder_type)) {
    return false;
  }

  if (att_data_id >= 0) {
    if (att_data_id >= attribute_data_.size()) {
      return false;  // Unexpected attribute data.
    }

    // Ensure that the attribute data is not mapped to a different attributes
    // decoder already.
    if (attribute_data_[att_data_id].decoder_id >= 0) {
      return false;
    }

    attribute_data_[att_data_id].decoder_id = att_decoder_id;
  } else {
    // Assign the attributes decoder to |pos_encoding_data_|.
    if (pos_data_decoder_id_ >= 0) {
      return false;  // Some other decoder is already using the data. Error.
    }
    pos_data_decoder_id_ = att_decoder_id;
  }

  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  if (decoder_->bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 2)) {
    uint8_t traversal_method_encoded;
    if (!decoder_->buffer()->Decode(&traversal_method_encoded)) {
      return false;
    }
    // Check that decoded traversal method is valid.
    if (traversal_method_encoded >= NUM_TRAVERSAL_METHODS) {
      return false;
    }
    traversal_method =
        static_cast<MeshTraversalMethod>(traversal_method_encoded);
  }

  const Mesh *mesh = decoder_->mesh();
  std::unique_ptr<PointsSequencer> sequencer;

  if (decoder_type == MESH_VERTEX_ATTRIBUTE) {
    // Per-vertex attribute decoder.

    MeshAttributeIndicesEncodingData *encoding_data = nullptr;
    if (att_data_id < 0) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;
      // Mark the attribute connectivity data invalid to ensure it's not used
      // later on.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else {
      return false;  // Unsupported method
    }
  } else {
    if (traversal_method != MESH_TRAVERSAL_DEPTH_FIRST) {
      return false;  // Unsupported method.
    }
    if (att_data_id < 0) {
      return false;  // Attribute data must be specified.
    }

    // Per-corner attribute decoder.

    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh, encoding_data));

    AttObserver att_observer(corner_table, mesh, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  std::unique_ptr<SequentialAttributeDecodersController> att_controller(
      new SequentialAttributeDecodersController(std::move(sequencer)));

  return decoder_->SetAttributesDecoder(att_decoder_id,
                                        std::move(att_controller));
}